

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenFunctionRunPasses
               (BinaryenFunctionRef func,BinaryenModuleRef module,char **passes,
               BinaryenIndex numPasses)

{
  __node_base_ptr *passName;
  ulong uVar1;
  undefined1 local_178 [8];
  PassRunner passRunner;
  allocator<char> local_31;
  
  wasm::PassRunner::PassRunner((PassRunner *)local_178,module);
  wasm::PassOptions::operator=
            ((PassOptions *)
             &passRunner.passes.
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&globalPassOptions);
  passName = &passRunner.skippedPasses._M_h._M_single_bucket;
  for (uVar1 = 0; numPasses != uVar1; uVar1 = uVar1 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)passName,passes[uVar1],&local_31);
    wasm::PassRunner::add((PassRunner *)local_178,(string *)passName);
    std::__cxx11::string::~string((string *)passName);
  }
  wasm::PassRunner::runOnFunction((PassRunner *)local_178,func);
  wasm::PassRunner::~PassRunner((PassRunner *)local_178);
  return;
}

Assistant:

void BinaryenFunctionRunPasses(BinaryenFunctionRef func,
                               BinaryenModuleRef module,
                               const char** passes,
                               BinaryenIndex numPasses) {
  PassRunner passRunner((Module*)module);
  passRunner.options = globalPassOptions;
  for (BinaryenIndex i = 0; i < numPasses; i++) {
    passRunner.add(passes[i]);
  }
  passRunner.runOnFunction((Function*)func);
}